

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

PtexFaceData * __thiscall Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid)

{
  undefined2 uVar6;
  int iVar1;
  pointer pFVar2;
  uint8_t *puVar3;
  Level **level;
  PtexFaceData *pPVar4;
  FaceData *pFVar5;
  
  if (((-1 < faceid) && (this->_ok != false)) && ((uint)faceid < (this->_header).nfaces)) {
    pFVar2 = (this->_faceinfo).
             super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (((pFVar2[(uint)faceid].flags & 1) == 0) &&
       (pFVar2 = pFVar2 + (uint)faceid, (pFVar2->res).vlog2 != '\0' || (pFVar2->res).ulog2 != '\0'))
    {
      level = (this->_levels).
              super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (*level == (Level *)0x0) {
        readLevel(this,0,level);
      }
      uVar6._0_1_ = (pFVar2->res).ulog2;
      uVar6._1_1_ = (pFVar2->res).vlog2;
      pFVar5 = getFace(this,0,*level,faceid,(Res)uVar6);
      return &pFVar5->super_PtexFaceData;
    }
    pPVar4 = (PtexFaceData *)operator_new(0x18);
    iVar1 = this->_pixelsize;
    puVar3 = this->_constdata;
    pPVar4->_vptr_PtexFaceData = (_func_int **)&PTR__PtexFaceData_0011cd28;
    pPVar4[1]._vptr_PtexFaceData = (_func_int **)(puVar3 + faceid * iVar1);
    *(int *)&pPVar4[2]._vptr_PtexFaceData = iVar1;
    return pPVar4;
  }
  pFVar5 = errorData(this,true);
  return &pFVar5->super_PtexFaceData;
}

Assistant:

PtexFaceData* PtexReader::getData(int faceid)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        return errorData(/*deleteOnRelease*/ true);
    }

    FaceInfo& fi = _faceinfo[faceid];
    if (fi.isConstant() || fi.res == 0) {
        return new ConstDataPtr(getConstData() + faceid * _pixelsize, _pixelsize);
    }

    // get level zero (full) res face
    Level* level = getLevel(0);
    FaceData* face = getFace(0, level, faceid, fi.res);
    return face;
}